

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O2

void __thiscall
Object_KeyNeedingQuoting_Test<wchar_t>::~Object_KeyNeedingQuoting_Test
          (Object_KeyNeedingQuoting_Test<wchar_t> *this)

{
  anon_unknown.dwarf_faccb::Object<wchar_t>::~Object(&this->super_Object<wchar_t>);
  operator_delete(this,0x188);
  return;
}

Assistant:

TYPED_TEST (Object, KeyNeedingQuoting) {
    using namespace ::pstore::dump;
    object v{{
        {"  k1", make_number (42)},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("\"  k1\" : 0x2a");
    EXPECT_EQ (expected, actual);
}